

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O1

void __thiscall mkvmuxer::Chapter::ShallowCopy(Chapter *this,Chapter *dst)

{
  uint64_t uVar1;
  int iVar2;
  
  dst->id_ = this->id_;
  uVar1 = this->end_timecode_;
  dst->start_timecode_ = this->start_timecode_;
  dst->end_timecode_ = uVar1;
  dst->uid_ = this->uid_;
  dst->displays_ = this->displays_;
  iVar2 = this->displays_count_;
  dst->displays_size_ = this->displays_size_;
  dst->displays_count_ = iVar2;
  return;
}

Assistant:

void Chapter::ShallowCopy(Chapter* dst) const {
  dst->id_ = id_;
  dst->start_timecode_ = start_timecode_;
  dst->end_timecode_ = end_timecode_;
  dst->uid_ = uid_;
  dst->displays_ = displays_;
  dst->displays_size_ = displays_size_;
  dst->displays_count_ = displays_count_;
}